

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O2

int zt_ptr_array_copy_data(zt_ptr_array *src,char **dstbuf)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (dstbuf == (char **)0x0 || src == (zt_ptr_array *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = 0;
    uVar1 = src->count;
    if (src->count < 1) {
      uVar1 = uVar2;
    }
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      dstbuf[uVar3] = (char *)src->array[uVar3];
    }
  }
  return uVar2;
}

Assistant:

int
zt_ptr_array_copy_data(zt_ptr_array * src, char ** dstbuf) {
    int32_t i;

    if (src == NULL || dstbuf == NULL) {
        return -1;
    }

    for (i = 0; i < src->count; i++) {
        dstbuf[i] = src->array[i];
    }

    return 0;
}